

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  TextureChannelClass TVar8;
  int x1_00;
  int y0_00;
  int y1_00;
  TextureFormat *pTVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_110;
  float local_10c;
  Vector<float,_2> local_e8;
  Vector<float,_2> local_e0;
  undefined1 local_d8 [8];
  ColorQuad quad;
  float maxB;
  float minB;
  float maxA;
  float minA;
  int y1;
  int y0;
  int x1;
  int x0;
  int i;
  int j;
  float searchStep;
  TextureChannelClass texClass;
  int h;
  int w;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 *result_local;
  int coordZ_local;
  Vec2 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  fVar10 = Vector<float,_2>::x(coord);
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar1 & 1),iVar2,fVar10,iVar3,iVar4);
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getHeight(level);
  fVar10 = Vector<float,_2>::y(coord);
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  iVar4 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,fVar10,iVar3,iVar4);
  fVar10 = Vector<float,_2>::x(&vBounds);
  dVar5 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  x0 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar7 = deFloorFloatToInt32(fVar10 - 0.5);
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  pTVar9 = ConstPixelBufferAccess::getFormat(level);
  TVar8 = getTextureChannelClass(pTVar9->type);
  if (TVar8 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_10c = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar8 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_110 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_110 = 0.0;
    }
    local_10c = local_110;
  }
  i = (int)local_10c;
  do {
    x1 = dVar5;
    if (dVar7 < x0) {
      return false;
    }
    for (; x1 <= dVar6; x1 = x1 + 1) {
      iVar4 = TexVerifierUtil::wrap(sampler->wrapS,x1,iVar2);
      x1_00 = TexVerifierUtil::wrap(sampler->wrapS,x1 + 1,iVar2);
      y0_00 = TexVerifierUtil::wrap(sampler->wrapT,x0,iVar3);
      y1_00 = TexVerifierUtil::wrap(sampler->wrapT,x0 + 1,iVar3);
      fVar10 = Vector<float,_2>::x(&vBounds);
      fVar10 = de::clamp<float>((fVar10 - 0.5) - (float)x1,0.0,1.0);
      fVar11 = Vector<float,_2>::y(&vBounds);
      fVar11 = de::clamp<float>((fVar11 - 0.5) - (float)x1,0.0,1.0);
      fVar12 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
      quad.p11.m_data[3] = de::clamp<float>((fVar12 - 0.5) - (float)x0,0.0,1.0);
      fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
      quad.p11.m_data[2] = de::clamp<float>((fVar12 - 0.5) - (float)x0,0.0,1.0);
      ColorQuad::ColorQuad((ColorQuad *)local_d8);
      lookupQuad((ColorQuad *)local_d8,level,sampler,iVar4,x1_00,y0_00,y1_00,coordZ);
      if (TVar8 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        i = (int)computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)local_d8);
      }
      Vector<float,_2>::Vector(&local_e0,fVar10,fVar11);
      Vector<float,_2>::Vector(&local_e8,quad.p11.m_data[3],quad.p11.m_data[2]);
      bVar1 = isBilinearRangeValid(prec,(ColorQuad *)local_d8,&local_e0,&local_e8,(float)i,result);
      if (bVar1) {
        return true;
      }
    }
    x0 = x0 + 1;
  } while( true );
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const Vec2&							coord,
								const int							coordZ,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int					minJ			= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int					maxJ			= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int					w				= level.getWidth();
	const int					h				= level.getHeight();

	const TextureChannelClass	texClass		= getTextureChannelClass(level.getFormat().type);
	float						searchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			ColorQuad quad;
			lookupQuad(quad, level, sampler, x0, x1, y0, y1, coordZ);

			if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
				searchStep = computeBilinearSearchStepFromFloatQuad(prec, quad);

			if (isBilinearRangeValid(prec, quad, Vec2(minA, maxA), Vec2(minB, maxB), searchStep, result))
				return true;
		}
	}

	return false;
}